

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanTypeConversions.cpp
# Opt level: O1

VkBorderColor Diligent::BorderColorToVkBorderColor(Float32 *BorderColor)

{
  float fVar1;
  string _msg;
  string local_28;
  
  fVar1 = (float)*BorderColor;
  if ((fVar1 == 0.0) && (!NAN(fVar1))) {
    if ((((float)BorderColor[1] == 0.0) &&
        (((!NAN((float)BorderColor[1]) && ((float)BorderColor[2] == 0.0)) &&
         (!NAN((float)BorderColor[2]))))) &&
       (((float)BorderColor[3] == 0.0 && (!NAN((float)BorderColor[3]))))) {
      return VK_BORDER_COLOR_FLOAT_TRANSPARENT_BLACK;
    }
    if (((fVar1 == 0.0) && (!NAN(fVar1))) &&
       (((float)BorderColor[1] == 0.0 &&
        ((((!NAN((float)BorderColor[1]) && ((float)BorderColor[2] == 0.0)) &&
          (!NAN((float)BorderColor[2]))) &&
         (((float)BorderColor[3] == 1.0 && (!NAN((float)BorderColor[3]))))))))) {
      return VK_BORDER_COLOR_FLOAT_OPAQUE_BLACK;
    }
  }
  if ((((fVar1 == 1.0) && (!NAN(fVar1))) &&
      (((float)BorderColor[1] == 1.0 &&
       (((!NAN((float)BorderColor[1]) && ((float)BorderColor[2] == 1.0)) &&
        (!NAN((float)BorderColor[2]))))))) &&
     (((float)BorderColor[3] == 1.0 && (!NAN((float)BorderColor[3]))))) {
    return VK_BORDER_COLOR_FLOAT_OPAQUE_WHITE;
  }
  FormatString<char[123]>
            (&local_28,
             (char (*) [123])
             "Vulkan samplers only allow transparent black (0,0,0,0), opaque black (0,0,0,1) or opaque white (1,1,1,1) as border colors."
            );
  if (DebugMessageCallback != (undefined *)0x0) {
    (*(code *)DebugMessageCallback)(2,local_28._M_dataplus._M_p,0,0,0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_28._M_dataplus._M_p != &local_28.field_2) {
    operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
  }
  return VK_BORDER_COLOR_FLOAT_TRANSPARENT_BLACK;
}

Assistant:

VkBorderColor BorderColorToVkBorderColor(const Float32 BorderColor[])
{
    VkBorderColor vkBorderColor = VK_BORDER_COLOR_FLOAT_TRANSPARENT_BLACK;
    if (BorderColor[0] == 0 && BorderColor[1] == 0 && BorderColor[2] == 0 && BorderColor[3] == 0)
        vkBorderColor = VK_BORDER_COLOR_FLOAT_TRANSPARENT_BLACK;
    else if (BorderColor[0] == 0 && BorderColor[1] == 0 && BorderColor[2] == 0 && BorderColor[3] == 1)
        vkBorderColor = VK_BORDER_COLOR_FLOAT_OPAQUE_BLACK;
    else if (BorderColor[0] == 1 && BorderColor[1] == 1 && BorderColor[2] == 1 && BorderColor[3] == 1)
        vkBorderColor = VK_BORDER_COLOR_FLOAT_OPAQUE_WHITE;
    else
    {
        LOG_ERROR_MESSAGE("Vulkan samplers only allow transparent black (0,0,0,0), opaque black (0,0,0,1) or opaque white (1,1,1,1) as border colors.");
    }

    return vkBorderColor;
}